

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mandelbrot.cpp
# Opt level: O2

void mandelbrot_colorize(int max_iterations,Gradient *gradient,
                        vector<PixelColor,_std::allocator<PixelColor>_> *image_data,
                        vector<int,_std::allocator<int>_> *iterations_histogram,
                        vector<CalculationResult,_std::allocator<CalculationResult>_>
                        *results_per_point)

{
  int iVar1;
  pointer pCVar2;
  pointer pPVar3;
  PixelColor PVar4;
  CalculationResult *results;
  pointer pCVar5;
  long lVar6;
  float fVar7;
  vector<float,_std::allocator<float>_> equalized_iterations;
  _Vector_base<float,_std::allocator<float>_> local_48;
  
  equalize_histogram((vector<float,_std::allocator<float>_> *)&local_48,iterations_histogram,
                     max_iterations);
  pCVar2 = (results_per_point->
           super__Vector_base<CalculationResult,_std::allocator<CalculationResult>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  lVar6 = 0;
  for (pCVar5 = (results_per_point->
                super__Vector_base<CalculationResult,_std::allocator<CalculationResult>_>)._M_impl.
                super__Vector_impl_data._M_start; pCVar5 != pCVar2; pCVar5 = pCVar5 + 1) {
    iVar1 = pCVar5->iter;
    if (iVar1 == max_iterations) {
      pPVar3 = (image_data->super__Vector_base<PixelColor,_std::allocator<PixelColor>_>)._M_impl.
               super__Vector_impl_data._M_start;
      *(undefined2 *)(&pPVar3->r + lVar6) = 0;
      (&pPVar3->b)[lVar6] = '\0';
    }
    else {
      fVar7 = std::__lerp<float>(local_48._M_impl.super__Vector_impl_data._M_start[iVar1],
                                 local_48._M_impl.super__Vector_impl_data._M_start[(long)iVar1 + 1],
                                 pCVar5->distance_to_next_iteration);
      PVar4 = color_from_gradient(gradient,fVar7 / (float)max_iterations);
      pPVar3 = (image_data->super__Vector_base<PixelColor,_std::allocator<PixelColor>_>)._M_impl.
               super__Vector_impl_data._M_start;
      *(short *)(&pPVar3->r + lVar6) = PVar4._0_2_;
      (&pPVar3->b)[lVar6] = PVar4.b;
    }
    lVar6 = lVar6 + 3;
  }
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_48);
  return;
}

Assistant:

void mandelbrot_colorize(const int max_iterations, const Gradient& gradient,
                         std::vector<PixelColor>& image_data, const std::vector<int>& iterations_histogram, const std::vector<CalculationResult>& results_per_point) noexcept
{
    const auto equalized_iterations = equalize_histogram(iterations_histogram, max_iterations);
    int pixel = 0;

    for (auto& results : results_per_point) {
        if (results.iter == max_iterations) {
            // points inside the Mandelbrot Set are always painted black
            image_data[static_cast<std::size_t>(pixel)] = PixelColor{0, 0, 0};
        } else {
            // The equalized iteration value (in the range of 0 .. max_iterations) represents the
            // position of the pixel color in the color gradiant and needs to be mapped to 0.0 .. 1.0.
            // To achieve smooth coloring we need to edge the equalized iteration towards the next
            // iteration, determined by the distance between the two iterations.
            const auto iter_curr = equalized_iterations[static_cast<std::size_t>(results.iter)];
            const auto iter_next = equalized_iterations[static_cast<std::size_t>(results.iter + 1)];

            const auto smoothed_iteration = std::lerp(iter_curr, iter_next, results.distance_to_next_iteration);
            const auto pos_in_gradient = smoothed_iteration / static_cast<float>(max_iterations);

            image_data[static_cast<std::size_t>(pixel)] = color_from_gradient(gradient, pos_in_gradient);
        }

        ++pixel;
    }
}